

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_api.c
# Opt level: O0

MPP_RET vp9d_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  RK_U32 RVar1;
  RK_U8 *pRVar2;
  size_t sVar3;
  uint local_74;
  RK_U8 *pos;
  RK_S32 consumed;
  RK_S32 out_size;
  RK_U8 *out_data;
  RK_U8 *pRStack_50;
  RK_S32 length;
  RK_U8 *buf;
  RK_S64 dts;
  RK_S64 pts;
  SplitContext_t_conflict *ps;
  Vp9CodecContext *vp9_ctx;
  HalDecTask *pHStack_20;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket pkt_local;
  void *ctx_local;
  
  vp9_ctx._4_4_ = 0;
  pts = *(RK_S64 *)((long)ctx + 8);
  dts = -1;
  buf = (RK_U8 *)0xffffffffffffffff;
  pRStack_50 = (RK_U8 *)0x0;
  out_data._4_4_ = 0;
  _consumed = (RK_U8 *)0x0;
  pos._4_4_ = -1;
  pos._0_4_ = 0;
  task->valid = 0xffffffff;
  ps = (SplitContext_t_conflict *)ctx;
  pHStack_20 = task;
  task_local = (HalDecTask *)pkt;
  pkt_local = ctx;
  dts = mpp_packet_get_pts(pkt);
  buf = (RK_U8 *)mpp_packet_get_dts(task_local);
  RVar1 = mpp_packet_get_eos(task_local);
  *(RK_U32 *)((long)&ps[0x4a].next_frame_offset + 4) = RVar1;
  pRVar2 = (RK_U8 *)mpp_packet_get_pos(task_local);
  pRStack_50 = pRVar2;
  sVar3 = mpp_packet_get_length(task_local);
  out_data._4_4_ = (uint)sVar3;
  pos._0_4_ = vp9d_split_frame((SplitContext_t_conflict *)pts,(RK_U8 **)&consumed,
                               (RK_S32 *)((long)&pos + 4),pRStack_50,out_data._4_4_);
  local_74 = (uint)pos;
  if ((int)(uint)pos < 0) {
    local_74 = out_data._4_4_;
  }
  mpp_packet_set_pos(task_local,pRVar2 + (int)local_74);
  if ((vp9d_debug & 0x10) != 0) {
    _mpp_log_l(4,"vp9d_api","pkt_len=%d, pts=%lld\n",(char *)0x0,(ulong)out_data._4_4_,dts);
  }
  if (pos._4_4_ < 1) {
    pHStack_20->valid = 0;
    (pHStack_20->flags).val =
         (pHStack_20->flags).val & 0xfffffffffffffffe |
         (ulong)*(uint *)((long)&ps[0x4a].next_frame_offset + 4) & 1;
  }
  else {
    vp9d_get_frame_stream((Vp9CodecContext *)ps,_consumed,pos._4_4_);
    pHStack_20->input_packet = (MppPacket)ps->pts;
    pHStack_20->valid = 1;
    mpp_packet_set_pts((MppPacket)ps->pts,dts);
    mpp_packet_set_dts((MppPacket)ps->pts,(RK_S64)buf);
    (pHStack_20->flags).val =
         (pHStack_20->flags).val & 0xfffffffffffffffe |
         (ulong)*(uint *)((long)&ps[0x4a].next_frame_offset + 4) & 1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp9d_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    Vp9CodecContext *vp9_ctx = (Vp9CodecContext *)ctx;
    SplitContext_t *ps = (SplitContext_t *)vp9_ctx->priv_data2;
    RK_S64 pts = -1;
    RK_S64 dts = -1;
    RK_U8 *buf = NULL;
    RK_S32 length = 0;
    RK_U8 *out_data = NULL;
    RK_S32 out_size = -1;
    RK_S32 consumed = 0;
    RK_U8 *pos = NULL;
    task->valid = -1;

    pts = mpp_packet_get_pts(pkt);
    dts = mpp_packet_get_dts(pkt);
    vp9_ctx->eos = mpp_packet_get_eos(pkt);
    buf = pos = mpp_packet_get_pos(pkt);
    length = (RK_S32)mpp_packet_get_length(pkt);

    consumed = vp9d_split_frame(ps, &out_data, &out_size, buf, length);
    pos += (consumed >= 0) ? consumed : length;

    mpp_packet_set_pos(pkt, pos);
    vp9d_dbg(VP9D_DBG_STRMIN, "pkt_len=%d, pts=%lld\n", length, pts);
    if (out_size > 0) {
        vp9d_get_frame_stream(vp9_ctx, out_data, out_size);
        task->input_packet = vp9_ctx->pkt;
        task->valid = 1;
        mpp_packet_set_pts(vp9_ctx->pkt, pts);
        mpp_packet_set_dts(vp9_ctx->pkt, dts);
        task->flags.eos = vp9_ctx->eos;
    } else {
        task->valid = 0;
        task->flags.eos = vp9_ctx->eos;
    }

    (void)pts;
    (void)dts;
    (void)task;
    return ret = MPP_OK;
}